

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliperMetadataDB.cpp
# Opt level: O0

void __thiscall
cali::CaliperMetadataDB::CaliperMetadataDBImpl::CaliperMetadataDBImpl(CaliperMetadataDBImpl *this)

{
  Node **local_98;
  allocator<char> local_89;
  string local_88;
  Node *local_68;
  allocator<char> local_59;
  string local_58;
  Node *local_38;
  Variant local_20;
  CaliperMetadataDBImpl *local_10;
  CaliperMetadataDBImpl *this_local;
  
  local_10 = this;
  Variant::Variant(&local_20);
  Node::Node(&this->m_root,0xffffffffffffffff,0xffffffffffffffff,&local_20);
  std::vector<cali::Node_*,_std::allocator<cali::Node_*>_>::vector(&this->m_nodes);
  ::std::mutex::mutex((mutex *)&this->m_node_lock);
  this->m_type_nodes[0] = (Node *)0x0;
  local_98 = this->m_type_nodes + 1;
  do {
    *local_98 = (Node *)0x0;
    local_98 = local_98 + 1;
  } while ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>_>_>
            *)local_98 != &this->m_attributes);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::Node_*>_>_>
  ::map(&this->m_attributes);
  ::std::mutex::mutex((mutex *)&this->m_attribute_lock);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector(&this->m_string_db);
  ::std::mutex::mutex((mutex *)&this->m_string_db_lock);
  ::std::vector<cali::Entry,_std::allocator<cali::Entry>_>::vector
            ((vector<cali::Entry,_std::allocator<cali::Entry>_> *)&this->m_globals);
  ::std::mutex::mutex((mutex *)&this->m_globals_lock);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&this->m_attr_aliases);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&this->m_attr_units);
  Attribute::Attribute(&this->m_alias_attr);
  Attribute::Attribute(&this->m_unit_attr);
  setup_bootstrap_nodes(this);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"attribute.alias",&local_59);
  local_38 = (Node *)create_attribute(this,&local_58,CALI_TYPE_STRING,0x40,0,(Attribute *)0x0,
                                      (Variant *)0x0);
  (this->m_alias_attr).m_node = local_38;
  ::std::__cxx11::string::~string((string *)&local_58);
  ::std::allocator<char>::~allocator(&local_59);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"attribute.unit",&local_89);
  local_68 = (Node *)create_attribute(this,&local_88,CALI_TYPE_STRING,0x40,0,(Attribute *)0x0,
                                      (Variant *)0x0);
  (this->m_unit_attr).m_node = local_68;
  ::std::__cxx11::string::~string((string *)&local_88);
  ::std::allocator<char>::~allocator(&local_89);
  return;
}

Assistant:

CaliperMetadataDBImpl() : m_root { CALI_INV_ID, CALI_INV_ID, {} }
    {
        setup_bootstrap_nodes();

        m_alias_attr =
            create_attribute("attribute.alias", CALI_TYPE_STRING, CALI_ATTR_SKIP_EVENTS, 0, nullptr, nullptr);
        m_unit_attr = create_attribute("attribute.unit", CALI_TYPE_STRING, CALI_ATTR_SKIP_EVENTS, 0, nullptr, nullptr);
    }